

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeConflict
          (ConflictSet *this,LocalDomChg *locdomchg,HighsDomainChange *conflict,HighsInt len)

{
  pointer pHVar1;
  pointer pLVar2;
  HighsDomain *this_00;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  int stackpos;
  HighsDomainChange *domchg;
  ulong uVar9;
  double dVar10;
  HighsDomainChange HVar11;
  int local_80;
  HighsInt local_7c;
  double local_78;
  ulong local_70;
  LocalDomChg *local_68;
  ulong local_60;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *local_58;
  undefined8 local_50;
  LocalDomChg local_48;
  
  pLVar2 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2;
  }
  local_58 = &this->resolvedDomainChanges;
  local_68 = locdomchg;
  HVar11 = flip(this->localdom,&locdomchg->domchg);
  local_70 = HVar11._8_8_ >> 0x20;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < len) {
    uVar7 = (ulong)(uint)len;
  }
  bVar4 = false;
  local_7c = len;
  local_60 = uVar7;
  while( true ) {
    local_50 = HVar11._8_8_;
    local_78 = HVar11.boundval;
    if (uVar9 == uVar7) break;
    if (((bVar4) || (conflict[uVar9].column != HVar11.column)) ||
       (conflict[uVar9].boundtype != (HighsBoundType)local_70)) {
LAB_002a7cad:
      domchg = conflict + uVar9;
      bVar6 = isActive(this->globaldom,domchg);
      HVar11.column = (undefined4)local_50;
      HVar11.boundtype = local_50._4_4_;
      HVar11.boundval = local_78;
      bVar5 = bVar4;
      if (!bVar6) {
        stackpos = local_68->pos + -1;
        this_00 = this->localdom;
        if (domchg->boundtype == kLower) {
          dVar10 = getColLowerPos(this_00,domchg->column,stackpos,&local_80);
          if ((local_80 == -1) || (dVar10 < domchg->boundval)) break;
          ppVar3 = (this_00->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_48.pos = local_80;
          while( true ) {
            lVar8 = (long)local_48.pos;
            if (ppVar3[lVar8].first < domchg->boundval) break;
            local_48.pos = ppVar3[lVar8].second;
          }
        }
        else {
          dVar10 = getColUpperPos(this_00,domchg->column,stackpos,&local_80);
          if ((local_80 == -1) || (domchg->boundval < dVar10)) break;
          ppVar3 = (this_00->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_48.pos = local_80;
          while( true ) {
            lVar8 = (long)local_48.pos;
            if (domchg->boundval < ppVar3[lVar8].first) break;
            local_48.pos = ppVar3[lVar8].second;
          }
        }
        pHVar1 = (this_00->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar8;
        local_48.domchg.boundval = pHVar1->boundval;
        local_48.domchg.column = pHVar1->column;
        local_48.domchg.boundtype = pHVar1->boundtype;
        std::
        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        ::emplace_back<HighsDomain::ConflictSet::LocalDomChg>(local_58,&local_48);
        HVar11.column = (undefined4)local_50;
        HVar11.boundtype = local_50._4_4_;
        HVar11.boundval = local_78;
        uVar7 = local_60;
      }
    }
    else {
      dVar10 = conflict[uVar9].boundval;
      if (local_70 == 0) {
        bVar5 = true;
        if (local_78 < dVar10) goto LAB_002a7cad;
      }
      else {
        bVar5 = true;
        if (dVar10 < local_78) goto LAB_002a7cad;
      }
    }
    bVar4 = bVar5;
    uVar9 = uVar9 + 1;
  }
  return (bool)((long)local_7c <= (long)uVar9 & bVar4);
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeConflict(
    const LocalDomChg& locdomchg, const HighsDomainChange* conflict,
    HighsInt len) {
  resolvedDomainChanges.clear();
  auto domchg = localdom.flip(locdomchg.domchg);
  bool foundDomchg = false;
  for (HighsInt i = 0; i < len; ++i) {
    if (!foundDomchg && conflict[i].column == domchg.column &&
        conflict[i].boundtype == domchg.boundtype) {
      if (conflict[i].boundtype == HighsBoundType::kLower) {
        if (conflict[i].boundval <= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      } else {
        if (conflict[i].boundval >= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      }
    }
    if (globaldom.isActive(conflict[i])) continue;

    HighsInt pos;
    if (conflict[i].boundtype == HighsBoundType::kLower) {
      double lb =
          localdom.getColLowerPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || lb < conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first >= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    } else {
      double ub =
          localdom.getColUpperPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || ub > conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first <= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    }

    resolvedDomainChanges.push_back(
        LocalDomChg{pos, localdom.domchgstack_[pos]});
  }

  return foundDomchg;
}